

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O3

CTypeID cp_decl_intern(CPState *cp,CPDecl *decl)

{
  ushort uVar1;
  CTypeID1 CVar2;
  CType *pCVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  CTypeID CVar10;
  uint info;
  CTInfo info_00;
  CTSize size;
  CType *fct;
  CType *local_38;
  
  size = 0xffffffff;
  info_00 = 0;
  uVar8 = 0;
  uVar5 = 0;
  do {
    info = decl->stack[uVar8].info;
    uVar7 = decl->stack[uVar8].size;
    uVar1 = decl->stack[uVar8].next;
    uVar9 = (ulong)uVar1;
    uVar6 = info >> 0x1c;
    if (uVar6 == 6) {
      if ((uVar5 != 0) &&
         ((uVar6 = cp->cts->tab[uVar5].info, (uVar6 & 0xf0000000) == 0x60000000 ||
          ((uVar6 & 0xfc000000) == 0x30000000)))) goto LAB_0013ae84;
      if (uVar1 == 0) {
        uVar9 = 0;
      }
      CVar2 = decl->stack[uVar8].sib;
      CVar10 = lj_ctype_new(cp->cts,&local_38);
      info_00 = info + uVar5;
      local_38->info = info_00;
      local_38->size = uVar7;
      local_38->sib = CVar2;
      size = 0xffffffff;
    }
    else if (uVar6 == 8) {
      if ((info & 0x80ff0000) == 0x80020000) {
        info_00 = info_00 & 0xfff0ffff | (uVar7 & 0xf) << 0x10;
      }
      else if ((info & 0x80ff0000) == 0x80010000) {
        info_00 = info_00 | uVar7;
      }
      CVar10 = lj_ctype_intern(cp->cts,info + uVar5,uVar7);
    }
    else if (uVar6 == 7) {
      CVar10 = info & 0xffff;
      pCVar3 = cp->cts->tab;
      info_00 = *(CTInfo *)((long)&pCVar3->info + (ulong)(CVar10 << 4));
      size = *(CTSize *)((long)&pCVar3->size + (ulong)(CVar10 << 4));
    }
    else {
      if (info < 0x10000000) {
        size = uVar7;
        if (info < 0x8000000) {
          uVar6 = decl->attr;
          uVar4 = uVar6 >> 8 & 0xff;
          if ((uVar4 != 0) &&
             (((info < 0x4000000 || ((char)(uVar6 >> 8) == '\b')) || ((uVar6 >> 8 & 0xff) == 4)))) {
            uVar7 = 0x1f;
            if (uVar4 != 0) {
              for (; uVar4 >> uVar7 == 0; uVar7 = uVar7 - 1) {
              }
            }
            if (3 < uVar7) {
              uVar7 = 4;
            }
            info = info & 0x7f0ffff | uVar7 << 0x10;
            uVar7 = uVar4;
          }
          uVar6 = uVar6 >> 4 & 0xf;
          size = uVar7;
          if (uVar6 != 0) {
            uVar4 = 0x1f;
            if (uVar7 != 0) {
              for (; uVar7 >> uVar4 == 0; uVar4 = uVar4 - 1) {
              }
            }
            if (uVar4 <= uVar6) {
              uVar5 = lj_ctype_intern(cp->cts,info,uVar7);
              uVar7 = uVar6;
              if (3 < uVar6) {
                uVar7 = 4;
              }
              uVar4 = info >> 0x10 & 0xf;
              if (uVar4 <= uVar7) {
                uVar4 = uVar7;
              }
              info = (info & 0x3000000) + uVar4 * 0x10000 + 0x38000000;
              size = 1 << (sbyte)uVar6;
            }
          }
        }
      }
      else if (uVar6 == 3) {
        if (decl->stack[uVar8].sib == 0) {
          if ((info_00 & 0xf0800000) == 0x20800000) goto LAB_0013ae84;
          if (((info_00 & 0xd0100000) == 0x10100000) || (size == 0xffffffff)) {
LAB_0013ae92:
            cp_err(cp,LJ_ERR_FFI_INVSIZE);
          }
          if (uVar7 == 0xffffffff) {
            uVar7 = 0xffffffff;
          }
          else {
            if (((ulong)size * (ulong)uVar7 & 0xffffffff80000000) != 0) goto LAB_0013ae92;
            uVar7 = (uint)((ulong)size * (ulong)uVar7);
          }
        }
        uVar6 = info & 0x3ff0ffff | info_00 & 0xf0000;
        if ((info_00 & 0xf0000) <= (info & 0xf0000)) {
          uVar6 = info;
        }
        info = info_00 & 0x3000000 | uVar6;
        size = uVar7;
      }
      else {
        size = uVar7;
        if (uVar6 == 2) {
          if ((uVar5 != 0) && ((cp->cts->tab[uVar5].info & 0xf0800000) == 0x20800000)) {
LAB_0013ae84:
            cp_err(cp,LJ_ERR_FFI_INVTYPE);
          }
          if (((~info & 0x20800000) == 0) && (info = info & 0x2effffff, uVar1 == 0)) {
            uVar9 = 0;
          }
        }
      }
      info_00 = info + uVar5;
      CVar10 = lj_ctype_intern(cp->cts,info_00,size);
    }
    uVar8 = uVar9;
    uVar5 = CVar10;
    if ((int)uVar9 == 0) {
      return CVar10;
    }
  } while( true );
}

Assistant:

static CTypeID cp_decl_intern(CPState *cp, CPDecl *decl)
{
  CTypeID id = 0;
  CPDeclIdx idx = 0;
  CTSize csize = CTSIZE_INVALID;
  CTSize cinfo = 0;
  do {
    CType *ct = &decl->stack[idx];
    CTInfo info = ct->info;
    CTInfo size = ct->size;
    /* The cid is already part of info for copies of pointers/functions. */
    idx = ct->next;
    if (ctype_istypedef(info)) {
      lj_assertCP(id == 0, "typedef not at toplevel");
      id = ctype_cid(info);
      /* Always refetch info/size, since struct/enum may have been completed. */
      cinfo = ctype_get(cp->cts, id)->info;
      csize = ctype_get(cp->cts, id)->size;
      lj_assertCP(ctype_isstruct(cinfo) || ctype_isenum(cinfo),
		  "typedef of bad type");
    } else if (ctype_isfunc(info)) {  /* Intern function. */
      CType *fct;
      CTypeID fid;
      CTypeID sib;
      if (id) {
	CType *refct = ctype_raw(cp->cts, id);
	/* Reject function or refarray return types. */
	if (ctype_isfunc(refct->info) || ctype_isrefarray(refct->info))
	  cp_err(cp, LJ_ERR_FFI_INVTYPE);
      }
      /* No intervening attributes allowed, skip forward. */
      while (idx) {
	CType *ctn = &decl->stack[idx];
	if (!ctype_isattrib(ctn->info)) break;
	idx = ctn->next;  /* Skip attribute. */
      }
      sib = ct->sib;  /* Next line may reallocate the C type table. */
      fid = lj_ctype_new(cp->cts, &fct);
      csize = CTSIZE_INVALID;
      fct->info = cinfo = info + id;
      fct->size = size;
      fct->sib = sib;
      id = fid;
    } else if (ctype_isattrib(info)) {
      if (ctype_isxattrib(info, CTA_QUAL))
	cinfo |= size;
      else if (ctype_isxattrib(info, CTA_ALIGN))
	CTF_INSERT(cinfo, ALIGN, size);
      id = lj_ctype_intern(cp->cts, info+id, size);
      /* Inherit csize/cinfo from original type. */
    } else {
      if (ctype_isnum(info)) {  /* Handle mode/vector-size attributes. */
	lj_assertCP(id == 0, "number not at toplevel");
	if (!(info & CTF_BOOL)) {
	  CTSize msize = ctype_msizeP(decl->attr);
	  CTSize vsize = ctype_vsizeP(decl->attr);
	  if (msize && (!(info & CTF_FP) || (msize == 4 || msize == 8))) {
	    CTSize malign = lj_fls(msize);
	    if (malign > 4) malign = 4;  /* Limit alignment. */
	    CTF_INSERT(info, ALIGN, malign);
	    size = msize;  /* Override size via mode. */
	  }
	  if (vsize) {  /* Vector size set? */
	    CTSize esize = lj_fls(size);
	    if (vsize >= esize) {
	      /* Intern the element type first. */
	      id = lj_ctype_intern(cp->cts, info, size);
	      /* Then create a vector (array) with vsize alignment. */
	      size = (1u << vsize);
	      if (vsize > 4) vsize = 4;  /* Limit alignment. */
	      if (ctype_align(info) > vsize) vsize = ctype_align(info);
	      info = CTINFO(CT_ARRAY, (info & CTF_QUAL) + CTF_VECTOR +
				      CTALIGN(vsize));
	    }
	  }
	}
      } else if (ctype_isptr(info)) {
	/* Reject pointer/ref to ref. */
	if (id && ctype_isref(ctype_raw(cp->cts, id)->info))
	  cp_err(cp, LJ_ERR_FFI_INVTYPE);
	if (ctype_isref(info)) {
	  info &= ~CTF_VOLATILE;  /* Refs are always const, never volatile. */
	  /* No intervening attributes allowed, skip forward. */
	  while (idx) {
	    CType *ctn = &decl->stack[idx];
	    if (!ctype_isattrib(ctn->info)) break;
	    idx = ctn->next;  /* Skip attribute. */
	  }
	}
      } else if (ctype_isarray(info)) {  /* Check for valid array size etc. */
	if (ct->sib == 0) {  /* Only check/size arrays not copied by unroll. */
	  if (ctype_isref(cinfo))  /* Reject arrays of refs. */
	    cp_err(cp, LJ_ERR_FFI_INVTYPE);
	  /* Reject VLS or unknown-sized types. */
	  if (ctype_isvltype(cinfo) || csize == CTSIZE_INVALID)
	    cp_err(cp, LJ_ERR_FFI_INVSIZE);
	  /* a[] and a[?] keep their invalid size. */
	  if (size != CTSIZE_INVALID) {
	    uint64_t xsz = (uint64_t)size * csize;
	    if (xsz >= 0x80000000u) cp_err(cp, LJ_ERR_FFI_INVSIZE);
	    size = (CTSize)xsz;
	  }
	}
	if ((cinfo & CTF_ALIGN) > (info & CTF_ALIGN))  /* Find max. align. */
	  info = (info & ~CTF_ALIGN) | (cinfo & CTF_ALIGN);
	info |= (cinfo & CTF_QUAL);  /* Inherit qual. */
      } else {
	lj_assertCP(ctype_isvoid(info), "bad ctype %08x", info);
      }
      csize = size;
      cinfo = info+id;
      id = lj_ctype_intern(cp->cts, info+id, size);
    }
  } while (idx);
  return id;
}